

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffpinit(fitsfile *fptr,int *status)

{
  int iVar1;
  tcolumn *ptVar2;
  FITSfile *pFVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  undefined8 uVar10;
  int groups;
  int naxis;
  int tstatus;
  int nspace;
  int bitpix;
  long pcount;
  undefined8 local_1fe8;
  double bzero;
  double bscale;
  LONGLONG blank;
  long gcount;
  int extend;
  int simple;
  char comm [73];
  LONGLONG naxes [999];
  
  if (0 < *status) {
    return *status;
  }
  pFVar3 = fptr->Fptr;
  if (fptr->HDUposition != pFVar3->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar3 = fptr->Fptr;
  }
  pFVar3->hdutype = 0;
  pFVar3->headend = pFVar3->logfilesize;
  groups = 0;
  tstatus = *status;
  ffgphd(fptr,999,&simple,&bitpix,&naxis,naxes,&pcount,&gcount,&extend,&bscale,&bzero,&blank,&nspace
         ,status);
  iVar1 = *status;
  if (iVar1 == 0xe9) {
    *status = tstatus;
  }
  else if (0 < iVar1) {
    return iVar1;
  }
  pFVar3 = fptr->Fptr;
  pFVar3->headend = pFVar3->nextkey - (long)(nspace * 0x50 + 0x50);
  pFVar3->datastart = ((pFVar3->nextkey + -0x50) / 0xb40) * 0xb40 + 0xb40;
  if ((0 < naxis) && (naxes[0] == 0)) {
    tstatus = 0;
    ffmaky(fptr,2,status);
    iVar1 = ffgkyl(fptr,"GROUPS",&groups,comm,&tstatus);
    if (iVar1 != 0) {
      groups = 0;
    }
  }
  if (bitpix < 0x10) {
    if (bitpix == -0x40) {
      lVar7 = 8;
      uVar10 = 0x52;
      goto LAB_0013bc39;
    }
    if (bitpix == -0x20) {
      lVar7 = 4;
      uVar10 = 0x2a;
      goto LAB_0013bc39;
    }
    if (bitpix == 8) {
      lVar7 = 1;
      uVar10 = 0xb;
      goto LAB_0013bc39;
    }
  }
  else {
    if (bitpix == 0x40) {
      lVar7 = 8;
      uVar10 = 0x51;
      goto LAB_0013bc39;
    }
    if (bitpix == 0x20) {
      lVar7 = 4;
      uVar10 = 0x29;
      goto LAB_0013bc39;
    }
    if (bitpix == 0x10) {
      lVar7 = 2;
      uVar10 = 0x15;
      goto LAB_0013bc39;
    }
  }
  uVar10 = 0;
  lVar7 = 0;
LAB_0013bc39:
  uVar8 = (ulong)(uint)naxis;
  pFVar3 = fptr->Fptr;
  pFVar3->imgdim = naxis;
  if (uVar8 == 0) {
    lVar5 = 0;
  }
  else {
    lVar5 = 1;
    if (groups == 0) {
      lVar5 = naxes[0];
    }
    pFVar3->imgnaxis[0] = naxes[0];
    if (1 < naxis) {
      lVar4 = 0;
      do {
        lVar5 = lVar5 * naxes[lVar4 + 1];
        pFVar3->imgnaxis[lVar4 + 1] = naxes[lVar4 + 1];
        lVar4 = lVar4 + 1;
      } while (uVar8 - 1 != lVar4);
    }
  }
  lVar4 = (pcount + lVar5) * lVar7;
  lVar6 = lVar4 * gcount;
  pFVar3->headstart[(long)pFVar3->curhdu + 1] =
       pFVar3->datastart + ((lVar6 + 0xb3f) / 0xb40) * 0xb40;
  pFVar3->heapstart = lVar6;
  pFVar3->heapsize = 0;
  pFVar3->compressimg = 0;
  if (uVar8 == 0) {
    pFVar3->rowlength = 0;
    pFVar3->tfield = 0;
    if (pFVar3->tilerow != (int *)0x0) {
      uVar9 = (uint)((pFVar3->znaxis[0] + -1) / pFVar3->tilesize[0]);
      if (uVar9 < 0x7fffffff) {
        uVar8 = 0;
        do {
          pFVar3 = fptr->Fptr;
          if (pFVar3->tiledata[uVar8] != (void *)0x0) {
            free(pFVar3->tiledata[uVar8]);
            pFVar3 = fptr->Fptr;
          }
          if (pFVar3->tilenullarray[uVar8] != (void *)0x0) {
            free(pFVar3->tilenullarray[uVar8]);
          }
          uVar8 = uVar8 + 1;
        } while (uVar9 + 1 != uVar8);
        pFVar3 = fptr->Fptr;
      }
      free(pFVar3->tileanynull);
      free(fptr->Fptr->tiletype);
      free(fptr->Fptr->tiledatasize);
      free(fptr->Fptr->tilenullarray);
      free(fptr->Fptr->tiledata);
      free(fptr->Fptr->tilerow);
      pFVar3 = fptr->Fptr;
      pFVar3->tilenullarray = (void **)0x0;
      pFVar3->tileanynull = (int *)0x0;
      pFVar3->tiletype = (int *)0x0;
      pFVar3->tiledata = (void **)0x0;
      pFVar3->tilerow = (int *)0x0;
      pFVar3->tiledatasize = (long *)0x0;
    }
    if (pFVar3->tableptr != (tcolumn *)0x0) {
      free(pFVar3->tableptr);
      pFVar3 = fptr->Fptr;
    }
    pFVar3->tableptr = (tcolumn *)0x0;
    pFVar3->origrows = 0;
    pFVar3->numrows = 0;
  }
  else {
    pFVar3->numrows = gcount;
    pFVar3->origrows = gcount;
    pFVar3->rowlength = lVar4;
    pFVar3->tfield = 2;
    if (pFVar3->tilerow != (int *)0x0) {
      uVar9 = (uint)((pFVar3->znaxis[0] + -1) / pFVar3->tilesize[0]);
      local_1fe8 = uVar10;
      if (uVar9 < 0x7fffffff) {
        uVar8 = 0;
        do {
          pFVar3 = fptr->Fptr;
          if (pFVar3->tiledata[uVar8] != (void *)0x0) {
            free(pFVar3->tiledata[uVar8]);
            pFVar3 = fptr->Fptr;
          }
          if (pFVar3->tilenullarray[uVar8] != (void *)0x0) {
            free(pFVar3->tilenullarray[uVar8]);
          }
          uVar8 = uVar8 + 1;
        } while (uVar9 + 1 != uVar8);
        pFVar3 = fptr->Fptr;
      }
      free(pFVar3->tileanynull);
      free(fptr->Fptr->tiletype);
      free(fptr->Fptr->tiledatasize);
      free(fptr->Fptr->tilenullarray);
      free(fptr->Fptr->tiledata);
      free(fptr->Fptr->tilerow);
      pFVar3 = fptr->Fptr;
      pFVar3->tilenullarray = (void **)0x0;
      pFVar3->tileanynull = (int *)0x0;
      pFVar3->tiletype = (int *)0x0;
      pFVar3->tiledata = (void **)0x0;
      pFVar3->tilerow = (int *)0x0;
      pFVar3->tiledatasize = (long *)0x0;
      uVar10 = local_1fe8;
    }
    if (pFVar3->tableptr != (tcolumn *)0x0) {
      free(pFVar3->tableptr);
    }
    ptVar2 = (tcolumn *)calloc(2,0xa0);
    if (ptVar2 == (tcolumn *)0x0) {
      ffxmsg(5,"malloc failed to get memory for FITS array descriptors (ffpinit)");
      fptr->Fptr->tableptr = (tcolumn *)0x0;
      *status = 0x6f;
      return 0x6f;
    }
    pFVar3 = fptr->Fptr;
    pFVar3->tableptr = ptVar2;
    ptVar2->tdatatype = (int)uVar10;
    ptVar2->twidth = lVar7;
    ptVar2->trepeat = pcount;
    ptVar2->tscale = 1.0;
    ptVar2->tnull = blank;
    ptVar2[1].tbcol = pcount * lVar7;
    ptVar2[1].tdatatype = (int)uVar10;
    ptVar2[1].twidth = lVar7;
    ptVar2[1].trepeat = lVar5;
    ptVar2[1].tscale = bscale;
    ptVar2[1].tzero = bzero;
    ptVar2[1].tnull = blank;
  }
  pFVar3->nextkey = pFVar3->headstart[pFVar3->curhdu];
  return *status;
}

Assistant:

int ffpinit(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)          /* IO - error status     */
/*
  initialize the parameters defining the structure of the primary array
  or an Image extension 
*/
{
    int groups, tstatus, simple, bitpix, naxis, extend, nspace;
    int ttype = 0, bytlen = 0, ii, ntilebins;
    long  pcount, gcount;
    LONGLONG naxes[999], npix, blank;
    double bscale, bzero;
    char comm[FLEN_COMMENT];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    (fptr->Fptr)->hdutype = IMAGE_HDU; /* primary array or IMAGE extension  */
    (fptr->Fptr)->headend = (fptr->Fptr)->logfilesize;  /* set max size */

    groups = 0;
    tstatus = *status;

    /* get all the descriptive info about this HDU */
    ffgphd(fptr, 999, &simple, &bitpix, &naxis, naxes, &pcount, &gcount, 
           &extend, &bscale, &bzero, &blank, &nspace, status);

    if (*status == NOT_IMAGE)
        *status = tstatus;    /* ignore 'unknown extension type' error */
    else if (*status > 0)
        return(*status);

    /*
       the logical end of the header is 80 bytes before the current position, 
       minus any trailing blank keywords just before the END keyword.
    */
    (fptr->Fptr)->headend = (fptr->Fptr)->nextkey - (80 * (nspace + 1));

    /* the data unit begins at the beginning of the next logical block */
    (fptr->Fptr)->datastart = (((fptr->Fptr)->nextkey - 80) / 2880 + 1)
                              * 2880;

    if (naxis > 0 && naxes[0] == 0)  /* test for 'random groups' */
    {
        tstatus = 0;
        ffmaky(fptr, 2, status);         /* reset to beginning of header */

        if (ffgkyl(fptr, "GROUPS", &groups, comm, &tstatus))
            groups = 0;          /* GROUPS keyword not found */
    }

    if (bitpix == BYTE_IMG)   /* test  bitpix and set the datatype code */
    {
        ttype=TBYTE;
        bytlen=1;
    }
    else if (bitpix == SHORT_IMG)
    {
        ttype=TSHORT;
        bytlen=2;
    }
    else if (bitpix == LONG_IMG)
    {
        ttype=TLONG;
        bytlen=4;
    }
    else if (bitpix == LONGLONG_IMG)
    {
        ttype=TLONGLONG;
        bytlen=8;
    }
    else if (bitpix == FLOAT_IMG)
    {
        ttype=TFLOAT;
        bytlen=4;
    }
    else if (bitpix == DOUBLE_IMG)
    {
        ttype=TDOUBLE;
        bytlen=8;
    }
        
    /*   calculate the size of the primary array  */
    (fptr->Fptr)->imgdim = naxis;
    if (naxis == 0)
    {
        npix = 0;
    }
    else
    {
        if (groups)
        {
            npix = 1;  /* NAXIS1 = 0 is a special flag for 'random groups' */
        }
        else
        {
            npix = naxes[0];
        }

        (fptr->Fptr)->imgnaxis[0] = naxes[0];
        for (ii=1; ii < naxis; ii++)
        {
            npix = npix*naxes[ii];   /* calc number of pixels in the array */
            (fptr->Fptr)->imgnaxis[ii] = naxes[ii];
        }
    }

    /*
       now we know everything about the array; just fill in the parameters:
       the next HDU begins in the next logical block after the data
    */

    (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] =
         (fptr->Fptr)->datastart + 
         ( ((LONGLONG) pcount + npix) * bytlen * gcount + 2879) / 2880 * 2880;

    /*
      initialize the fictitious heap starting address (immediately following
      the array data) and a zero length heap.  This is used to find the
      end of the data when checking the fill values in the last block. 
    */
    (fptr->Fptr)->heapstart = (npix + pcount) * bytlen * gcount;
    (fptr->Fptr)->heapsize = 0;

    (fptr->Fptr)->compressimg = 0;  /* this is not a compressed image */

    if (naxis == 0)
    {
        (fptr->Fptr)->rowlength = 0;    /* rows have zero length */
        (fptr->Fptr)->tfield = 0;       /* table has no fields   */

        /* free the tile-compressed image cache, if it exists */
        if ((fptr->Fptr)->tilerow) {
           ntilebins = 
	    (((fptr->Fptr)->znaxis[0] - 1) / ((fptr->Fptr)->tilesize[0])) + 1;

           for (ii = 0; ii < ntilebins; ii++) {
             if ((fptr->Fptr)->tiledata[ii]) {
	       free((fptr->Fptr)->tiledata[ii]);
             }

             if ((fptr->Fptr)->tilenullarray[ii]) {
	       free((fptr->Fptr)->tilenullarray[ii]);
             }
            }
	    
	    free((fptr->Fptr)->tileanynull);
	    free((fptr->Fptr)->tiletype);	   
	    free((fptr->Fptr)->tiledatasize);
	    free((fptr->Fptr)->tilenullarray);
	    free((fptr->Fptr)->tiledata);
	    free((fptr->Fptr)->tilerow);

	    (fptr->Fptr)->tileanynull = 0;
	    (fptr->Fptr)->tiletype = 0;	   
	    (fptr->Fptr)->tiledatasize = 0;
	    (fptr->Fptr)->tilenullarray = 0;
	    (fptr->Fptr)->tiledata = 0;
	    (fptr->Fptr)->tilerow = 0;
        }

        if ((fptr->Fptr)->tableptr)
           free((fptr->Fptr)->tableptr); /* free memory for the old CHDU */

        (fptr->Fptr)->tableptr = 0;     /* set a null table structure pointer */
        (fptr->Fptr)->numrows = 0;
        (fptr->Fptr)->origrows = 0;
    }
    else
    {
      /*
        The primary array is actually interpreted as a binary table.  There
        are two columns: the first column contains the group parameters if any.
        The second column contains the primary array of data as a single vector
        column element. In the case of 'random grouped' format, each group
        is stored in a separate row of the table.
      */
        /* the number of rows is equal to the number of groups */
        (fptr->Fptr)->numrows = gcount;
        (fptr->Fptr)->origrows = gcount;

        (fptr->Fptr)->rowlength = (npix + pcount) * bytlen; /* total size */
        (fptr->Fptr)->tfield = 2;  /* 2 fields: group params and the image */

        /* free the tile-compressed image cache, if it exists */
        if ((fptr->Fptr)->tilerow) {

           ntilebins = 
	    (((fptr->Fptr)->znaxis[0] - 1) / ((fptr->Fptr)->tilesize[0])) + 1;

           for (ii = 0; ii < ntilebins; ii++) {
             if ((fptr->Fptr)->tiledata[ii]) {
	       free((fptr->Fptr)->tiledata[ii]);
             }

             if ((fptr->Fptr)->tilenullarray[ii]) {
	       free((fptr->Fptr)->tilenullarray[ii]);
             }
            }
	    
	    free((fptr->Fptr)->tileanynull);
	    free((fptr->Fptr)->tiletype);	   
	    free((fptr->Fptr)->tiledatasize);
	    free((fptr->Fptr)->tilenullarray);
	    free((fptr->Fptr)->tiledata);
	    free((fptr->Fptr)->tilerow);

	    (fptr->Fptr)->tileanynull = 0;
	    (fptr->Fptr)->tiletype = 0;	   
	    (fptr->Fptr)->tiledatasize = 0;
	    (fptr->Fptr)->tilenullarray = 0;
	    (fptr->Fptr)->tiledata = 0;
	    (fptr->Fptr)->tilerow = 0;
        }

        if ((fptr->Fptr)->tableptr)
           free((fptr->Fptr)->tableptr); /* free memory for the old CHDU */

        colptr = (tcolumn *) calloc(2, sizeof(tcolumn) ) ;

        if (!colptr)
        {
          ffpmsg
          ("malloc failed to get memory for FITS array descriptors (ffpinit)");
          (fptr->Fptr)->tableptr = 0;  /* set a null table structure pointer */
          return(*status = ARRAY_TOO_BIG);
        }

        /* copy the table structure address to the fitsfile structure */
        (fptr->Fptr)->tableptr = colptr; 

        /* the first column represents the group parameters, if any */
        colptr->tbcol = 0;
        colptr->tdatatype = ttype;
        colptr->twidth = bytlen;
        colptr->trepeat = (LONGLONG) pcount;
        colptr->tscale = 1.;
        colptr->tzero = 0.;
        colptr->tnull = blank;

        colptr++;  /* increment pointer to the second column */

        /* the second column represents the image array */
        colptr->tbcol = pcount * bytlen; /* col starts after the group parms */
        colptr->tdatatype = ttype; 
        colptr->twidth = bytlen;
        colptr->trepeat = npix;
        colptr->tscale = bscale;
        colptr->tzero = bzero;
        colptr->tnull = blank;
    }

    /* reset next keyword pointer to the start of the header */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu ];

    return(*status);
}